

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O1

FuncInfo * __thiscall Scope::GetEnclosingFunc(Scope *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  do {
    if (this->func != (FuncInfo *)0x0) goto LAB_0083ab56;
    this = this->enclosingScope;
  } while (this != (Scope *)0x0);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/Scope.h"
                     ,0xe4,"(scope)","scope");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_0083ab56:
  return this->func;
}

Assistant:

FuncInfo *GetEnclosingFunc()
    {
        Scope *scope = this;
        while (scope && scope->func == nullptr)
        {
            scope = scope->GetEnclosingScope();
        }
        AnalysisAssert(scope);
        return scope->func;
    }